

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxapp.h
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  
  iVar1 = (**ktxinfo.super_ktxApp._vptr_ktxApp)(&ktxinfo,argc,argv);
  return iVar1;
}

Assistant:

int main(int argc, char* argv[])
{
    InitUTF8CLI(argc, argv);
#if 0
    if (!SetConsoleOutputCP(CP_UTF8)) {
        cerr << theApp.getName() << "warning: failed to set UTF-8 code page for console output."
             << endl;
    }
#endif
    return theApp.main(argc, argv);
}